

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O1

char * blogc_render(bc_slist_t *tmpl,bc_slist_t *sources,bc_slist_t *listing_entries,
                   bc_trie_t *config,_Bool listing)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bc_string_t *str;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  bc_trie_t *pbVar10;
  byte bVar11;
  _bc_slist_t *p_Var12;
  _bc_slist_t *p_Var13;
  int *piVar14;
  bc_slist_t *foreach_var;
  bc_trie_t *local_98;
  bc_slist_t *local_80;
  char *local_78;
  _bc_slist_t *local_60;
  _bc_slist_t *local_58;
  bc_slist_t *local_38;
  
  if (tmpl == (bc_slist_t *)0x0) {
    return (char *)0x0;
  }
  bVar3 = false;
  str = bc_string_new();
  bVar2 = false;
  local_58 = (_bc_slist_t *)0x0;
  local_80 = (bc_slist_t *)0x0;
  foreach_var = (bc_slist_t *)0x0;
  local_78 = (char *)0x0;
  local_98 = (bc_trie_t *)0x0;
  local_60 = (_bc_slist_t *)0x0;
  p_Var12 = (bc_slist_t *)0x0;
  local_38 = listing_entries;
  do {
    piVar14 = (int *)tmpl->data;
    switch(*piVar14) {
    case 1:
    case 3:
      bVar11 = 0;
      goto LAB_001040eb;
    case 2:
      bVar11 = 1;
LAB_001040eb:
      if (*(char **)(piVar14 + 2) == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pbVar10 = (bc_trie_t *)0x0;
        if (bVar2) {
          pbVar10 = local_98;
        }
        pcVar8 = blogc_format_variable(*(char **)(piVar14 + 2),config,pbVar10,local_78,foreach_var);
      }
      if (piVar14[1] == 0) {
        if ((bVar11 | pcVar8 == (char *)0x0) == 1) {
          bVar11 = bVar11 & pcVar8 == (char *)0x0;
          goto LAB_0010448d;
        }
LAB_00104491:
        bVar3 = false;
      }
      else {
        pcVar6 = *(char **)(piVar14 + 4);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          sVar5 = strlen(pcVar6);
          if (((sVar5 < 2) || (*pcVar6 != '\"')) || (pcVar6[sVar5 - 1] != '\"')) {
            pbVar10 = (bc_trie_t *)0x0;
            if (bVar2) {
              pbVar10 = local_98;
            }
            pcVar6 = blogc_format_variable(pcVar6,config,pbVar10,local_78,foreach_var);
          }
          else {
            pcVar6 = bc_strndup(pcVar6 + 1,sVar5 - 2);
          }
        }
        bVar11 = 0;
        if ((pcVar8 != (char *)0x0) && (bVar11 = 0, pcVar6 != (char *)0x0)) {
          iVar4 = strcmp(pcVar8,pcVar6);
          bVar11 = 1;
          if (iVar4 == 0) {
            uVar1 = piVar14[1] & 2;
          }
          else {
            uVar1 = piVar14[1] & 1;
          }
          if ((uVar1 == 0) && ((-1 < iVar4 || (bVar11 = 1, (*(byte *)(piVar14 + 1) & 4) == 0)))) {
            if (iVar4 < 1) {
              bVar11 = 0;
            }
            else {
              bVar11 = (*(byte *)(piVar14 + 1) & 8) >> 3;
            }
          }
        }
        free(pcVar6);
LAB_0010448d:
        if (bVar11 != 0) goto LAB_00104491;
        lVar7 = 0;
LAB_001044b2:
        tmpl = tmpl->next;
        iVar4 = *tmpl->data;
        if (iVar4 - 1U < 3) {
          lVar9 = 1;
          goto LAB_001044ee;
        }
        if (iVar4 != 4 || lVar7 != 0) goto code_r0x001044d6;
        bVar3 = true;
      }
LAB_001044fa:
      free(pcVar8);
      break;
    case 4:
      if (!bVar3) {
        lVar7 = 0;
LAB_00104311:
        tmpl = tmpl->next;
        if (2 < *tmpl->data - 1U) goto code_r0x00104323;
        lVar9 = 1;
        goto LAB_0010433e;
      }
    case 5:
switchD_0010406f_caseD_5:
      bVar3 = false;
      break;
    case 6:
      if (local_80 == (bc_slist_t *)0x0) {
        if (*(char **)(piVar14 + 2) == (char *)0x0) {
          local_80 = (bc_slist_t *)0x0;
        }
        else {
          pbVar10 = (bc_trie_t *)0x0;
          if (bVar2) {
            pbVar10 = local_98;
          }
          local_80 = blogc_split_list_variable(*(char **)(piVar14 + 2),config,pbVar10);
        }
        if (local_80 == (bc_slist_t *)0x0) {
          iVar4 = *piVar14;
          while (iVar4 != 7) {
            tmpl = tmpl->next;
            iVar4 = *tmpl->data;
          }
          break;
        }
        local_78 = bc_strdup(*(char **)(piVar14 + 2));
        foreach_var = local_80;
        local_58 = tmpl;
      }
      if (foreach_var == (bc_slist_t *)0x0) {
        local_78 = bc_strdup(*(char **)(piVar14 + 2));
        foreach_var = local_80;
        local_58 = tmpl;
      }
      break;
    case 7:
      if ((local_58 == (_bc_slist_t *)0x0) || (foreach_var == (bc_slist_t *)0x0)) {
LAB_00104438:
        bc_slist_free_full(local_80,free);
        free(local_78);
        local_78 = (char *)0x0;
        local_80 = (bc_slist_t *)0x0;
        local_58 = (_bc_slist_t *)0x0;
        break;
      }
      foreach_var = foreach_var->next;
      p_Var13 = local_58;
      if (foreach_var == (bc_slist_t *)0x0) {
        foreach_var = (bc_slist_t *)0x0;
        goto LAB_00104438;
      }
      goto LAB_0010450b;
    case 8:
      pcVar8 = *(char **)(piVar14 + 2);
      iVar4 = strcmp("entry",pcVar8);
      if (iVar4 == 0) {
        if (listing) {
          bVar2 = true;
          iVar4 = *piVar14;
          while (iVar4 != 9) {
            tmpl = tmpl->next;
            iVar4 = *tmpl->data;
          }
          break;
        }
        if (sources == (bc_slist_t *)0x0) {
          local_98 = (bc_trie_t *)0x0;
          p_Var12 = sources;
        }
        else {
          local_98 = (bc_trie_t *)sources->data;
          p_Var12 = sources;
        }
      }
      iVar4 = strcmp("listing_entry",pcVar8);
      if (iVar4 == 0) {
        if (local_38 == (bc_slist_t *)0x0) {
          local_38 = (bc_slist_t *)0x0;
          pbVar10 = (bc_trie_t *)0x0;
        }
        else {
          pbVar10 = (bc_trie_t *)local_38->data;
          local_38 = local_38->next;
        }
        if (pbVar10 != (bc_trie_t *)0x0 && listing) {
          p_Var12 = (bc_slist_t *)0x0;
          local_98 = pbVar10;
        }
        else {
          while (*piVar14 != 9) {
            tmpl = tmpl->next;
            piVar14 = (int *)tmpl->data;
          }
        }
        if (pbVar10 != (bc_trie_t *)0x0 && listing) goto LAB_001045b4;
      }
      else {
        iVar4 = strcmp("listing",pcVar8);
        if ((((iVar4 == 0) || (iVar4 = strcmp("listing_empty",pcVar8), iVar4 == 0)) ||
            (iVar4 = strcmp("listing_once",pcVar8), iVar4 == 0)) && (!listing)) {
          bVar2 = true;
          iVar4 = *piVar14;
          while (iVar4 != 9) {
            tmpl = tmpl->next;
            iVar4 = *tmpl->data;
          }
          break;
        }
LAB_001045b4:
        pcVar8 = *(char **)(piVar14 + 2);
        iVar4 = strcmp("listing_empty",pcVar8);
        if ((sources == (bc_slist_t *)0x0) || (iVar4 != 0)) {
          iVar4 = strcmp("listing",pcVar8);
          bVar2 = true;
          if (iVar4 == 0) {
            if (sources != (bc_slist_t *)0x0) {
              if (p_Var12 == (bc_slist_t *)0x0) {
                local_60 = tmpl;
                p_Var12 = sources;
              }
              local_98 = (bc_trie_t *)p_Var12->data;
              break;
            }
            iVar4 = *piVar14;
            while (iVar4 != 9) {
              tmpl = tmpl->next;
              iVar4 = *tmpl->data;
            }
          }
        }
        else {
          iVar4 = *piVar14;
          while (iVar4 != 9) {
            tmpl = tmpl->next;
            iVar4 = *tmpl->data;
          }
        }
      }
      bVar2 = true;
      break;
    case 9:
      bVar2 = false;
      if ((local_60 != (_bc_slist_t *)0x0) && (p_Var12 != (bc_slist_t *)0x0)) {
        p_Var12 = p_Var12->next;
        bVar2 = false;
        p_Var13 = local_60;
        if (p_Var12 != (_bc_slist_t *)0x0) goto LAB_0010450b;
        p_Var12 = (bc_slist_t *)0x0;
        local_60 = (_bc_slist_t *)0x0;
      }
      break;
    case 10:
      if (*(char **)(piVar14 + 2) != (char *)0x0) {
        pbVar10 = (bc_trie_t *)0x0;
        if (bVar2) {
          pbVar10 = local_98;
        }
        pcVar8 = blogc_format_variable(*(char **)(piVar14 + 2),config,pbVar10,local_78,foreach_var);
        if (pcVar8 != (char *)0x0) {
          bc_string_append(str,pcVar8);
          free(pcVar8);
        }
      }
      break;
    case 0xb:
      if (*(char **)(piVar14 + 2) != (char *)0x0) {
        bc_string_append(str,*(char **)(piVar14 + 2));
      }
    }
    p_Var13 = tmpl->next;
LAB_0010450b:
    tmpl = p_Var13;
    if (p_Var13 == (_bc_slist_t *)0x0) {
      pcVar8 = bc_string_free(str,false);
      return pcVar8;
    }
  } while( true );
code_r0x00104323:
  if (*tmpl->data == 5) {
    lVar9 = -1;
    if (lVar7 != 0) {
LAB_0010433e:
      lVar7 = lVar7 + lVar9;
      goto LAB_00104311;
    }
    goto switchD_0010406f_caseD_5;
  }
  goto LAB_00104311;
code_r0x001044d6:
  if (iVar4 == 5) {
    lVar9 = -1;
    if (lVar7 == 0) goto LAB_001044fa;
LAB_001044ee:
    lVar7 = lVar7 + lVar9;
  }
  goto LAB_001044b2;
}

Assistant:

char*
blogc_render(bc_slist_t *tmpl, bc_slist_t *sources, bc_slist_t *listing_entries,
    bc_trie_t *config, bool listing)
{
    if (tmpl == NULL)
        return NULL;

    bc_slist_t *current_source = NULL;
    bc_slist_t *listing_start = NULL;

    bc_string_t *str = bc_string_new();

    bc_trie_t *tmp_source = NULL;
    char *config_value = NULL;
    char *defined = NULL;

    size_t if_count = 0;

    char *foreach_name = NULL;
    bc_slist_t *foreach_var = NULL;
    bc_slist_t *foreach_var_start = NULL;
    bc_slist_t *foreach_start = NULL;

    bool if_not = false;
    bool inside_block = false;
    bool evaluate = false;
    bool valid_else = false;

    int cmp = 0;

    bc_slist_t *tmp = tmpl;
    bc_slist_t *current_listing_entry = listing_entries;
    while (tmp != NULL) {
        blogc_template_node_t *node = tmp->data;

        switch (node->type) {

            case BLOGC_TEMPLATE_NODE_CONTENT:
                if (node->data[0] != NULL)
                    bc_string_append(str, node->data[0]);
                break;

            case BLOGC_TEMPLATE_NODE_BLOCK:
                inside_block = true;
                if_count = 0;
                if (0 == strcmp("entry", node->data[0])) {
                    if (listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = sources;
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                if (0 == strcmp("listing_entry", node->data[0])) {
                    bc_trie_t *listing_entry = NULL;
                    if (current_listing_entry != NULL) {
                        listing_entry = current_listing_entry->data;
                        current_listing_entry = current_listing_entry->next;
                    }
                    if (listing_entry == NULL || !listing) {
                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = NULL;
                    tmp_source = listing_entry;
                }
                else if ((0 == strcmp("listing", node->data[0])) ||
                         (0 == strcmp("listing_empty", node->data[0])) ||
                         (0 == strcmp("listing_once", node->data[0]))) {
                    if (!listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing_empty", node->data[0])) {
                    if (sources != NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing", node->data[0])) {
                    if (sources == NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    if (current_source == NULL) {
                        listing_start = tmp;
                        current_source = sources;
                    }
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_VARIABLE:
                if (node->data[0] != NULL) {
                    config_value = blogc_format_variable(node->data[0],
                        config, inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                    if (config_value != NULL) {
                        bc_string_append(str, config_value);
                        free(config_value);
                        config_value = NULL;
                        break;
                    }
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                inside_block = false;
                if (listing_start != NULL && current_source != NULL) {
                    current_source = current_source->next;
                    if (current_source != NULL) {
                        tmp = listing_start;
                        continue;
                    }
                    else
                        listing_start = NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_IFNDEF:
                if_not = true;

            case BLOGC_TEMPLATE_NODE_IF:
            case BLOGC_TEMPLATE_NODE_IFDEF:
                if_count = 0;
                defined = NULL;
                if (node->data[0] != NULL)
                    defined = blogc_format_variable(node->data[0], config,
                        inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                evaluate = false;
                if (node->op != 0) {
                    // Strings that start with a '"' are actually strings, the
                    // others are meant to be looked up as a second variable
                    // check.
                    char *defined2 = NULL;
                    if (node->data[1] != NULL) {
                        if ((strlen(node->data[1]) >= 2) &&
                            (node->data[1][0] == '"') &&
                            (node->data[1][strlen(node->data[1]) - 1] == '"'))
                        {
                            defined2 = bc_strndup(node->data[1] + 1,
                                strlen(node->data[1]) - 2);
                        }
                        else {
                            defined2 = blogc_format_variable(node->data[1],
                                config, inside_block ? tmp_source : NULL,
                                foreach_name, foreach_var);
                        }
                    }

                    if (defined != NULL && defined2 != NULL) {
                        cmp = strcmp(defined, defined2);
                        if (cmp != 0 && node->op & BLOGC_TEMPLATE_OP_NEQ)
                            evaluate = true;
                        else if (cmp == 0 && node->op & BLOGC_TEMPLATE_OP_EQ)
                            evaluate = true;
                        else if (cmp < 0 && node->op & BLOGC_TEMPLATE_OP_LT)
                            evaluate = true;
                        else if (cmp > 0 && node->op & BLOGC_TEMPLATE_OP_GT)
                            evaluate = true;
                    }

                    free(defined2);
                }
                else {
                    if (if_not && defined == NULL)
                        evaluate = true;
                    if (!if_not && defined != NULL)
                        evaluate = true;
                }
                if (!evaluate) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        if ((node->type == BLOGC_TEMPLATE_NODE_ELSE) &&
                            (if_count == 0))
                        {
                            // this is somewhat complex. only an else statement
                            // right after a non evaluated block should be considered
                            // valid, because all the inner conditionals were just
                            // skipped, and all the outter conditionals evaluated
                            // to true.
                            valid_else = true;
                            break;
                        }
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                else {
                    valid_else = false;
                }
                free(defined);
                defined = NULL;
                if_not = false;
                break;

            case BLOGC_TEMPLATE_NODE_ELSE:
                if_count = 0;
                if (!valid_else) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        // no need to handle else statements here, because every
                        // if should have an endif.
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                valid_else = false;
                break;

            case BLOGC_TEMPLATE_NODE_ENDIF:
                // any endif statement should invalidate valid_else, to avoid
                // propagation to outter conditionals.
                valid_else = false;
                if (if_count > 0)
                    if_count--;
                break;

            case BLOGC_TEMPLATE_NODE_FOREACH:
                if (foreach_var_start == NULL) {
                    if (node->data[0] != NULL)
                        foreach_var_start = blogc_split_list_variable(node->data[0],
                            config, inside_block ? tmp_source : NULL);

                    if (foreach_var_start != NULL) {
                        foreach_name = bc_strdup(node->data[0]);
                        foreach_var = foreach_var_start;
                        foreach_start = tmp;
                    }
                    else {

                        // we can just skip anything and walk until the next
                        // 'endforeach'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDFOREACH) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }

                if (foreach_var == NULL) {
                    foreach_start = tmp;
                    foreach_name = bc_strdup(node->data[0]);
                    foreach_var = foreach_var_start;
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                if (foreach_start != NULL && foreach_var != NULL) {
                    foreach_var = foreach_var->next;
                    if (foreach_var != NULL) {
                        tmp = foreach_start;
                        continue;
                    }
                }
                foreach_start = NULL;
                bc_slist_free_full(foreach_var_start, free);
                foreach_var_start = NULL;
                free(foreach_name);
                foreach_name = NULL;
                break;
        }
        tmp = tmp->next;
    }

    // no need to free temporary variables here. the template parser makes sure
    // that templates are sane and statements are closed.

    return bc_string_free(str, false);
}